

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-pound.c
# Opt level: O0

void close_cb(uv_handle_t *handle)

{
  conn_rec_conflict *conn;
  uv_handle_t *handle_local;
  
  free(handle);
  return;
}

Assistant:

static void close_cb(uv_handle_t* handle) {
  conn_rec* p = (conn_rec*)handle->data;

  ASSERT_NOT_NULL(handle);
  closed_streams++;

#if DEBUG
  printf("close_cb %d\n", p->i);
#endif

  if (uv_now(loop) - start < 10000) {
    p->make_connect(p);
  }
}